

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_clib___index(lua_State *L)

{
  CTState *cts;
  uint64_t uVar1;
  int iVar2;
  TValue *pTVar3;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar4;
  uint uVar5;
  
  pTVar3 = ffi_clib_index(L);
  aVar4 = pTVar3->field_4;
  if (aVar4.it >> 0xf == 0x1fff5) {
    cts = *(CTState **)((L->glref).ptr64 + 0x180);
    cts->L = L;
    aVar4 = (anon_struct_8_2_7fa0a05d_for_TValue_4)pTVar3->u64;
    uVar5 = cts->tab[*(ushort *)(((ulong)aVar4 & 0x7fffffffffff) + 10)].info;
    if ((uVar5 & 0xf0000000) == 0xc0000000) {
      uVar5 = uVar5 & 0xffff;
      iVar2 = lj_cconv_tv_ct(cts,cts->tab + uVar5,uVar5,L->top + -1,
                             *(uint8_t **)(((ulong)aVar4 & 0x7fffffffffff) + 0x10));
      if (iVar2 == 0) {
        return 1;
      }
      uVar1 = (L->glref).ptr64;
      if (*(ulong *)(uVar1 + 0x10) < *(ulong *)(uVar1 + 0x18)) {
        return 1;
      }
      lj_gc_step(L);
      return 1;
    }
  }
  L->top[-1].field_4 = aVar4;
  return 1;
}

Assistant:

LJLIB_CF(ffi_clib___index)	LJLIB_REC(clib_index 1)
{
  TValue *tv = ffi_clib_index(L);
  if (tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *s = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(s->info)) {
      CTypeID sid = ctype_cid(s->info);
      void *sp = *(void **)cdataptr(cd);
      CType *ct = ctype_raw(cts, sid);
      if (lj_cconv_tv_ct(cts, ct, sid, L->top-1, sp))
	lj_gc_check(L);
      return 1;
    }
  }
  copyTV(L, L->top-1, tv);
  return 1;
}